

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.cpp
# Opt level: O0

bool __thiscall
r_comp::Compiler::read_wildcard
          (Compiler *this,Ptr *node,uint16_t write_index,uint16_t *extent_index,bool write)

{
  bool bVar1;
  element_type *peVar2;
  Atom *this_00;
  shared_ptr<r_comp::RepliStruct> local_80;
  allocator local_69;
  string local_68 [48];
  Atom local_38 [7];
  byte local_31;
  uint16_t *puStack_30;
  bool write_local;
  uint16_t *extent_index_local;
  Ptr *pPStack_20;
  uint16_t write_index_local;
  Ptr *node_local;
  Compiler *this_local;
  
  local_31 = write;
  puStack_30 = extent_index;
  extent_index_local._6_2_ = write_index;
  pPStack_20 = node;
  node_local = (Ptr *)this;
  peVar2 = std::__shared_ptr_access<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)node);
  bVar1 = std::operator==(&peVar2->cmd,":");
  if (bVar1) {
    if ((this->state).pattern_lvl == 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_68," error: no wildcards allowed outside a pattern skeleton",&local_69);
      std::shared_ptr<r_comp::RepliStruct>::shared_ptr(&local_80,node);
      set_error(this,(string *)local_68,&local_80);
      std::shared_ptr<r_comp::RepliStruct>::~shared_ptr(&local_80);
      std::__cxx11::string::~string(local_68);
      std::allocator<char>::~allocator((allocator<char> *)&local_69);
      this_local._7_1_ = false;
    }
    else {
      if ((local_31 & 1) != 0) {
        r_code::Atom::Wildcard((ushort)local_38);
        this_00 = r_code::vector<r_code::Atom>::operator[]
                            ((vector<r_code::Atom> *)(this->current_object + 8),
                             (ulong)extent_index_local._6_2_);
        r_code::Atom::operator=(this_00,local_38);
        r_code::Atom::~Atom(local_38);
      }
      this_local._7_1_ = true;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool Compiler::read_wildcard(RepliStruct::Ptr node, uint16_t write_index, uint16_t &extent_index, bool write)
{
    if (node->cmd == ":") {
        if (state.pattern_lvl) {
            if (write) {
                current_object->code[write_index] = Atom::Wildcard();
            }

            return true;
        } else {
            set_error(" error: no wildcards allowed outside a pattern skeleton", node);
            return false;
        }
    }

    return false;
}